

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_tree.cpp
# Opt level: O2

idx_t duckdb::CreateTreeRecursive<duckdb::PipelineRenderNode>
                (RenderTree *result,PipelineRenderNode *op,idx_t x,idx_t y)

{
  idx_t iVar1;
  unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true> node;
  unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_> local_70;
  idx_t width;
  unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_> local_60;
  idx_t y_local;
  idx_t x_local;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  y_local = y;
  x_local = x;
  CreateNode((duckdb *)&node,op->op);
  if ((op->child).
      super_unique_ptr<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PipelineRenderNode_*,_std::default_delete<duckdb::PipelineRenderNode>_>
      .super__Head_base<0UL,_duckdb::PipelineRenderNode_*,_false>._M_head_impl ==
      (PipelineRenderNode *)0x0) {
    local_60._M_t.
    super___uniq_ptr_impl<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::RenderTreeNode_*,_std::default_delete<duckdb::RenderTreeNode>_>.
    super__Head_base<0UL,_duckdb::RenderTreeNode_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true,_true>
          )(__uniq_ptr_data<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true,_true>
            )node.
             super_unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::RenderTreeNode_*,_std::default_delete<duckdb::RenderTreeNode>_>
             .super__Head_base<0UL,_duckdb::RenderTreeNode_*,_false>._M_head_impl;
    node.super_unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>._M_t
    .super___uniq_ptr_impl<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::RenderTreeNode_*,_std::default_delete<duckdb::RenderTreeNode>_>.
    super__Head_base<0UL,_duckdb::RenderTreeNode_*,_false>._M_head_impl =
         (unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>)
         (__uniq_ptr_data<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true,_true>
          )0x0;
    RenderTree::SetNode(result,x,y,
                        (unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>
                         *)&local_60);
    ::std::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>::
    ~unique_ptr(&local_60);
    iVar1 = 1;
  }
  else {
    width = 0;
    local_38 = (code *)0x0;
    pcStack_30 = (code *)0x0;
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    local_48._M_unused._M_object = operator_new(0x28);
    *(idx_t **)local_48._M_unused._0_8_ = &x_local;
    *(idx_t **)((long)local_48._M_unused._0_8_ + 8) = &width;
    *(idx_t **)((long)local_48._M_unused._0_8_ + 0x10) = &y_local;
    *(unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true> **)
     ((long)local_48._M_unused._0_8_ + 0x18) = &node;
    *(RenderTree **)((long)local_48._M_unused._0_8_ + 0x20) = result;
    pcStack_30 = std::
                 _Function_handler<void_(const_duckdb::PipelineRenderNode_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/render_tree.cpp:137:39)>
                 ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(const_duckdb::PipelineRenderNode_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/render_tree.cpp:137:39)>
               ::_M_manager;
    anon_unknown.dwarf_20e7f4a::TreeChildrenIterator::Iterate<duckdb::PipelineRenderNode>
              (op,(function<void_(const_duckdb::PipelineRenderNode_&)> *)&local_48);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_48);
    local_70._M_t.
    super___uniq_ptr_impl<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::RenderTreeNode_*,_std::default_delete<duckdb::RenderTreeNode>_>.
    super__Head_base<0UL,_duckdb::RenderTreeNode_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true,_true>
          )(__uniq_ptr_data<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true,_true>
            )node.
             super_unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::RenderTreeNode_*,_std::default_delete<duckdb::RenderTreeNode>_>
             .super__Head_base<0UL,_duckdb::RenderTreeNode_*,_false>._M_head_impl;
    node.super_unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>._M_t
    .super___uniq_ptr_impl<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::RenderTreeNode_*,_std::default_delete<duckdb::RenderTreeNode>_>.
    super__Head_base<0UL,_duckdb::RenderTreeNode_*,_false>._M_head_impl =
         (unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>)
         (__uniq_ptr_data<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true,_true>
          )0x0;
    RenderTree::SetNode(result,x_local,y_local,
                        (unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>
                         *)&local_70);
    ::std::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>::
    ~unique_ptr(&local_70);
    iVar1 = width;
  }
  ::std::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>::
  ~unique_ptr(&node.
               super_unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>
             );
  return iVar1;
}

Assistant:

static idx_t CreateTreeRecursive(RenderTree &result, const T &op, idx_t x, idx_t y) {
	auto node = CreateNode(op);

	if (!TreeChildrenIterator::HasChildren(op)) {
		result.SetNode(x, y, std::move(node));
		return 1;
	}
	idx_t width = 0;
	// render the children of this node
	TreeChildrenIterator::Iterate<T>(op, [&](const T &child) {
		auto child_x = x + width;
		auto child_y = y + 1;
		node->AddChildPosition(child_x, child_y);
		width += CreateTreeRecursive<T>(result, child, child_x, child_y);
	});
	result.SetNode(x, y, std::move(node));
	return width;
}